

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind_def.cpp
# Opt level: O0

PyObject * PyInit_slopeOP(void)

{
  int iVar1;
  char *__s1;
  PyObject **ppPVar2;
  error_already_set *e;
  exception *e_1;
  handle local_30;
  module m;
  size_t len;
  char *runtime_ver;
  char *compiled_ver;
  
  __s1 = (char *)Py_GetVersion();
  m.super_object.super_handle.m_ptr = (object)strlen("3.10");
  iVar1 = strncmp(__s1,"3.10",(size_t)m.super_object.super_handle.m_ptr);
  if ((iVar1 == 0) &&
     ((__s1[(long)m.super_object.super_handle.m_ptr] < '0' ||
      ('9' < __s1[(long)m.super_object.super_handle.m_ptr])))) {
    pybind11::module::module((module *)&local_30,"slopeOP",(char *)0x0);
    pybind11_init_slopeOP((module *)&local_30);
    ppPVar2 = pybind11::handle::ptr(&local_30);
    compiled_ver = (char *)*ppPVar2;
    pybind11::module::~module((module *)&local_30);
  }
  else {
    PyErr_Format(_PyExc_ImportError,
                 "Python version mismatch: module was compiled for Python %s, but the interpreter version is incompatible: %s."
                 ,"3.10",__s1);
    compiled_ver = (char *)0x0;
  }
  return (PyObject *)compiled_ver;
}

Assistant:

PYBIND11_MODULE(slopeOP, m)
{
    py::class_<PeltResult<float, float>>(m, "PeltResult")
        .def(py::init([](vector<unsigned int> cp, vector<float> x, vector<float> y, double cost) {
            return new PeltResult<float, float>(cp, x, y, cost);
        }))
        .def_readwrite("cp", &PeltResult<float, float>::cp)
        .def_readwrite("x", &PeltResult<float, float>::x)
        .def_readwrite("y", &PeltResult<float, float>::y)
        .def_readwrite("cost", &PeltResult<float, float>::cost);

    py::class_<OmegaOP>(m, "OmegaOP")
        .def("GetChangepoints", [](const OmegaOP &a) {
                //
                std::vector<int> cp = a.GetChangepoints();
                for (size_t i=0; i<cp.size(); i++) {
                    cp[i] --;
                }
                return cp;
            }, pybind11::return_value_policy::copy)
        .def("GetParameters", &OmegaOP::GetParameters)
        .def("GetGlobalCost", &OmegaOP::GetGlobalCost)
        .def("GetPruning", &OmegaOP::GetPruning);

    py::class_<OmegaSN>(m, "OmegaSN")
        .def("GetChangepoints", [](const OmegaSN &a) {
                //
                std::vector<int> cp = a.GetChangepoints();
                for (size_t i=0; i<cp.size(); i++) {
                    cp[i] --;
                }
                return cp;
            }, pybind11::return_value_policy::copy)
        .def("GetParameters", &OmegaSN::GetParameters)
        .def("GetGlobalCost", &OmegaSN::GetGlobalCost)
        .def("GetPruning", &OmegaSN::GetPruning);

    m.doc() = "python interface to segmentaition algorithms"; // optional module docstring
    m.def("op2D", &op2D_float, "OP algorithm 2D (piece-wise linear fit)", py::arg("x"), py::arg("y"), py::arg("penality"));
    m.def("slopeOP", &slopeOP, "slopeOP algorithm", py::arg("data"), py::arg("states"), py::arg("penality"),
          py::arg("constraint") = "null", py::arg("minAngle") = 0, py::arg("type") = "channel");
    m.def("slopeSN", &slopeSN, "slopeSN algorithm", py::arg("data"), py::arg("states"), py::arg("nb_segments"),
          py::arg("constraint") = "null");
}